

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Operation::Operation(Operation *this,Operation *from)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->inputs_).map_.elements_.num_elements_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Operation_003f9e80;
  (this->inputs_).map_.elements_.num_buckets_ = 1;
  (this->inputs_).map_.elements_.seed_ = 0;
  (this->inputs_).map_.elements_.index_of_first_non_null_ = 1;
  (this->inputs_).map_.elements_.table_ = (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->inputs_).map_.elements_.alloc_.arena_ = (Arena *)0x0;
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::
  RepeatedPtrField(&this->outputs_,&from->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::RepeatedPtrField
            (&this->blocks_,&from->blocks_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  (this->attributes_).map_.elements_.num_elements_ = 0;
  (this->attributes_).map_.elements_.num_buckets_ = 1;
  (this->attributes_).map_.elements_.seed_ = 0;
  (this->attributes_).map_.elements_.index_of_first_non_null_ = 1;
  (this->attributes_).map_.elements_.table_ =
       (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->attributes_).map_.elements_.alloc_.arena_ = (Arena *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (this_00,&(from->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->inputs_,&from->inputs_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::MergeFrom(&this->attributes_,&from->attributes_);
  (this->type_).tagged_ptr_.ptr_ =
       &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (ulong)(from->type_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = this_00->ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->type_,uVar3,puVar2);
  }
  return;
}

Assistant:

Operation::Operation(const Operation& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      outputs_(from.outputs_),
      blocks_(from.blocks_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  inputs_.MergeFrom(from.inputs_);
  attributes_.MergeFrom(from.attributes_);
  type_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    type_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_type().empty()) {
    type_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_type(), 
      GetArenaForAllocation());
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.Operation)
}